

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AcousticEmitterSystem.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::AcousticEmitterSystem::Encode(AcousticEmitterSystem *this,KDataStream *stream)

{
  KDataStream *pKVar1;
  KDataStream *stream_local;
  AcousticEmitterSystem *this_local;
  
  pKVar1 = KDataStream::operator<<(stream,this->m_ui16EmitterName);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui8Function);
  KDataStream::operator<<(pKVar1,this->m_ui8EmitterIDNumber);
  return;
}

Assistant:

void AcousticEmitterSystem::Encode( KDataStream & stream ) const
{
    stream << m_ui16EmitterName
           << m_ui8Function
           << m_ui8EmitterIDNumber;
}